

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

void __thiscall OpenMD::RigidBody::updateAtomVel(RigidBody *this,int frame)

{
  undefined4 *puVar1;
  double dVar2;
  Atom *pAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint i_2;
  int iVar7;
  undefined4 extraout_var;
  double *pdVar8;
  undefined4 extraout_var_00;
  pointer pVVar9;
  undefined4 extraout_var_01;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  uint j;
  long lVar13;
  double *pdVar14;
  uint k;
  uint i;
  long lVar15;
  double (*__return_storage_ptr__) [3];
  ulong uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  Vector<double,_3U> result_3;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  Mat3x3d mat;
  Mat3x3d skewMat;
  Mat3x3d I;
  double local_208 [4];
  double local_1e8 [10];
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  uint uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  double local_168 [10];
  double local_118 [10];
  double local_c8;
  undefined1 auStack_c0 [16];
  double dStack_b0;
  undefined8 local_a8;
  undefined1 auStack_a0 [16];
  double dStack_90;
  undefined8 local_88;
  double local_78 [8];
  double local_38;
  
  dStack_90 = 0.0;
  local_a8 = 0;
  auStack_a0 = ZEXT816(0);
  dStack_b0 = 0.0;
  local_c8 = 0.0;
  auStack_c0 = ZEXT816(0);
  lVar15 = 0;
  local_88 = 0;
  iVar7 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar13 = *(long *)(CONCAT44(extraout_var,iVar7) + 0x60 + (this->super_StuntDouble).storage_);
  lVar10 = (long)(this->super_StuntDouble).localIndex_;
  local_188 = *(undefined8 *)(lVar13 + 0x10 + lVar10 * 0x18);
  local_178 = (undefined4)local_188;
  uStack_180 = 0;
  uStack_174 = (uint)((ulong)local_188 >> 0x20) ^ 0x80000000;
  uStack_170 = 0;
  uStack_16c = 0x80000000;
  puVar1 = (undefined4 *)(lVar13 + lVar10 * 0x18);
  local_198 = *puVar1;
  uStack_194 = puVar1[1];
  uStack_190 = puVar1[2];
  uStack_18c = puVar1[3];
  (*(this->super_StuntDouble)._vptr_StuntDouble[5])(local_78,this);
  local_c8 = 0.0;
  auVar6._8_4_ = uStack_190;
  auVar6._0_8_ = CONCAT44(uStack_194,local_198);
  auVar6._12_4_ = uStack_18c;
  auVar18._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
  auVar18._0_8_ = local_188;
  dStack_b0 = (double)CONCAT44(uStack_174,local_178) / local_38;
  uVar17 = (undefined4)((ulong)local_78[4] >> 0x20);
  auVar4._8_4_ = SUB84(local_78[4],0);
  auVar4._0_8_ = local_38;
  auVar4._12_4_ = uVar17;
  auStack_c0 = divpd(auVar18,auVar4);
  local_a8 = 0;
  dStack_90 = -(double)CONCAT44(uStack_194,local_198) / local_78[0];
  auVar5._8_4_ = SUB84(local_78[4],0);
  auVar5._0_8_ = local_78[0];
  auVar5._12_4_ = uVar17;
  auStack_a0 = divpd(auVar6,auVar5);
  local_88 = 0;
  __return_storage_ptr__ = (double (*) [3])local_168;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this->super_StuntDouble,frame);
  local_1e8[8] = 0.0;
  local_1e8[6] = 0.0;
  local_1e8[7] = 0.0;
  local_1e8[4] = 0.0;
  local_1e8[5] = 0.0;
  local_1e8[2] = 0.0;
  local_1e8[3] = 0.0;
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  do {
    lVar13 = 0;
    pdVar11 = &local_c8;
    do {
      dVar2 = local_1e8[lVar15 * 3 + lVar13];
      lVar10 = 0;
      pdVar8 = pdVar11;
      do {
        dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar10] * *pdVar8;
        lVar10 = lVar10 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar10 != 3);
      local_1e8[lVar15 * 3 + lVar13] = dVar2;
      lVar13 = lVar13 + 1;
      pdVar11 = pdVar11 + 1;
    } while (lVar13 != 3);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar15 != 3);
  pdVar8 = local_118;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[8] = 0.0;
  pdVar11 = local_1e8;
  lVar13 = 0;
  do {
    lVar10 = 0;
    pdVar14 = pdVar8;
    do {
      *pdVar14 = pdVar11[lVar10];
      lVar10 = lVar10 + 1;
      pdVar14 = pdVar14 + 3;
    } while (lVar10 != 3);
    lVar13 = lVar13 + 1;
    pdVar8 = pdVar8 + 1;
    pdVar11 = pdVar11 + 3;
  } while (lVar13 != 3);
  iVar7 = (*((this->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar10 = (long)(this->super_StuntDouble).localIndex_;
  lVar13 = *(long *)(CONCAT44(extraout_var_00,iVar7) + 0x18 + (this->super_StuntDouble).storage_);
  local_1e8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar10 * 0x18);
  pdVar11 = (double *)(lVar13 + lVar10 * 0x18);
  local_1e8[0] = *pdVar11;
  local_1e8[1] = pdVar11[1];
  pVVar9 = (this->refCoords_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->refCoords_).
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pVVar9) {
    uVar16 = 0;
    do {
      pAVar3 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16];
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar13 = 0;
      pdVar11 = local_118;
      do {
        dVar2 = local_168[lVar13];
        lVar10 = 0;
        do {
          dVar2 = dVar2 + pdVar11[lVar10] * pVVar9[uVar16].super_Vector<double,_3U>.data_[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_168[lVar13] = dVar2;
        lVar13 = lVar13 + 1;
        pdVar11 = pdVar11 + 3;
      } while (lVar13 != 3);
      local_208[0] = 0.0;
      local_208[1] = 0.0;
      local_208[2] = 0.0;
      lVar13 = 0;
      do {
        local_208[lVar13] = local_1e8[lVar13] + local_168[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      iVar7 = (*((pAVar3->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
      lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_;
      lVar13 = *(long *)(CONCAT44(extraout_var_01,iVar7) + 0x18 +
                        (pAVar3->super_StuntDouble).storage_);
      pdVar11 = (double *)(lVar13 + lVar10 * 0x18);
      *pdVar11 = local_208[0];
      pdVar11[1] = local_208[1];
      *(double *)(lVar13 + 0x10 + lVar10 * 0x18) = local_208[2];
      uVar16 = (ulong)((int)uVar16 + 1);
      pVVar9 = (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(this->refCoords_).
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3) *
               -0x5555555555555555;
    } while (uVar16 <= uVar12 && uVar12 - uVar16 != 0);
  }
  return;
}

Assistant:

void RigidBody::updateAtomVel(int frame) {
    Mat3x3d skewMat;
    ;

    Vector3d ji = getJ(frame);
    Mat3x3d I   = getI();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = ji[2] / I(2, 2);
    skewMat(0, 2) = -ji[1] / I(1, 1);

    skewMat(1, 0) = -ji[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = ji[0] / I(0, 0);

    skewMat(2, 0) = ji[1] / I(1, 1);
    skewMat(2, 1) = -ji[0] / I(0, 0);
    skewMat(2, 2) = 0;

    Mat3x3d mat    = (getA(frame) * skewMat).transpose();
    Vector3d rbVel = getVel(frame);

    Vector3d velRot;
    for (unsigned int i = 0; i < refCoords_.size(); ++i) {
      atoms_[i]->setVel(rbVel + mat * refCoords_[i], frame);
    }
  }